

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O1

void soul::heart::Checker::sanityCheck(Program *program,BuildSettings *settings)

{
  Program::getMainProcessor(program);
  sanityCheckModules(program);
  sanityCheckAdvanceAndStreamCalls(program);
  checkConnections(program);
  checkForRecursiveFunctions(program,settings->maxStackSize);
  checkForInfiniteLoops(program);
  checkBlockParameters(program);
  checkForCyclesInGraphs(program);
  checkStreamOperations(program);
  return;
}

Assistant:

static void sanityCheck (const Program& program, const BuildSettings settings = {})
    {
        ignoreUnused (program.getMainProcessor());
        sanityCheckModules (program);
        sanityCheckAdvanceAndStreamCalls (program);
        checkConnections (program);
        checkForRecursiveFunctions (program, settings.maxStackSize);
        checkForInfiniteLoops (program);
        checkBlockParameters (program);
        checkForCyclesInGraphs (program);
        checkStreamOperations (program);
    }